

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O0

RhsTraits * __thiscall
mp::
Convert1ExpC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ClassifyRhsLin(Convert1ExpC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *this,double b,int v)

{
  array<double,_2UL> c;
  initializer_list<int> __l;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
  *this_00;
  const_reference pvVar1;
  reference pvVar2;
  undefined4 in_EDX;
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RSI;
  array<int,_2UL> in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
  *pConExp;
  RhsTraits *result;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  value_type vVar3;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  SubexprTraits<2> *this_01;
  _Type aiVar4;
  undefined4 *local_90;
  undefined4 local_84;
  undefined4 *local_80;
  undefined8 local_78;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
  *local_70;
  SubexprTraits<2> local_58;
  undefined1 local_1d;
  undefined4 local_1c;
  double local_18;
  
  local_18 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_1d = 0;
  local_58.vars2del_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0xffffffff;
  local_90 = (undefined4 *)
             ((long)&local_58.vars2del_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4);
  local_1c = in_EDX;
  do {
    *local_90 = 0;
    local_90 = local_90 + 1;
  } while ((pointer *)local_90 !=
           &local_58.vars2del_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  local_58.coefs_._M_elems[0] = 0.0;
  local_58.coefs_._M_elems[1] = 0.0;
  local_58.vars_._M_elems[0] = 0;
  local_58.vars_._M_elems[1] = 0;
  this_01 = &local_58;
  aiVar4 = in_RDI._M_elems;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x66ea86);
  c._M_elems[1] = (double)in_RSI;
  c._M_elems[0] = (double)aiVar4;
  SubexprTraits<2>::SubexprTraits(this_01,c,in_RDI,in_stack_ffffffffffffff40);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_RDI._M_elems);
  if (0.0 <= local_18) {
    MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::MC(in_RSI);
    this_00 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::
              GetInitExpressionOfType<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::ExpId>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)aiVar4,in_RDI._M_elems[1]);
    if (this_00 !=
        (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
         *)0x0) {
      local_70 = this_00;
      CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::ExpId>::GetArguments
                (&this_00->
                  super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::ExpId>)
      ;
      pvVar1 = std::array<int,_1UL>::operator[]
                         ((array<int,_1UL> *)this_00,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      vVar3 = *pvVar1;
      pvVar2 = std::array<int,_2UL>::operator[]
                         ((array<int,_2UL> *)this_00,CONCAT44(vVar3,in_stack_ffffffffffffff38));
      *pvVar2 = vVar3;
      local_84 = local_1c;
      local_80 = &local_84;
      local_78 = 1;
      __l._M_len = (size_type)in_RSI;
      __l._M_array = (iterator)aiVar4;
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_RDI._M_elems,__l);
      *(undefined1 *)((long)in_RDI._M_elems + 0x30) = 1;
    }
  }
  aiVar4[0] = aiVar4[0];
  aiVar4[1] = aiVar4[1];
  return (RhsTraits *)aiVar4;
}

Assistant:

RhsTraits ClassifyRhsLin(double b, int v) {
    assert(v>=0);
    RhsTraits result {{b, b}, {-1} /*y = constant 1*/};
    if (b>=0.0) {
      if (auto pConExp = MC().template
          GetInitExpressionOfType<ExpConstraint>(v)) {
        result.vars_[1] = pConExp->GetArguments()[0];  // the z
        result.vars2del_ = {v};                        // delete v
        result.valid_ = true;
      }
    }
    return result;
  }